

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::BinaryAggregateHeap<double,_duckdb::string_t,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<double,_duckdb::string_t,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,double *key,string_t *value)

{
  bool bVar1;
  idx_t iVar2;
  pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_> *__last;
  STORAGE_TYPE *pSVar3;
  
  if (this->size < this->capacity) {
    pSVar3 = this->heap + this->size;
    (pSVar3->first).value = *key;
    HeapEntry<duckdb::string_t>::Assign(&pSVar3->second,allocator,value);
    pSVar3 = this->heap;
    iVar2 = this->size + 1;
    this->size = iVar2;
    __last = pSVar3 + iVar2;
  }
  else {
    bVar1 = GreaterThan::Operation<double>((double *)this->heap,key);
    if (!bVar1) {
      return;
    }
    ::std::
    pop_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&)>
              (this->heap,this->heap + this->size,Compare);
    iVar2 = this->size;
    pSVar3 = this->heap;
    pSVar3[iVar2 - 1].first.value = *key;
    HeapEntry<duckdb::string_t>::Assign(&pSVar3[iVar2 - 1].second,allocator,value);
    pSVar3 = this->heap;
    __last = pSVar3 + this->size;
  }
  ::std::
  push_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&)>
            (pSVar3,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}